

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O0

char * state_align_search_hyp(ps_search_t *search,int32 *out_score)

{
  dictword_t *pdVar1;
  dictword_t *pdVar2;
  int iVar3;
  ps_alignment_entry_t *ppVar4;
  size_t sVar5;
  char *pcVar6;
  char *word_1;
  int32 wid_1;
  ps_alignment_entry_t *ent;
  int32 wid;
  char *word;
  size_t hyp_len;
  ps_alignment_iter_t *itor;
  state_align_search_t *sas;
  int32 *out_score_local;
  ps_search_t *search_local;
  
  if (search->hyp_str != (char *)0x0) {
    ckd_free(search->hyp_str);
  }
  search->hyp_str = (char *)0x0;
  if (search[1].type == (char *)0x0) {
    search_local = (ps_search_t *)0x0;
  }
  else {
    hyp_len = (size_t)ps_alignment_words((ps_alignment_t *)search[1].type);
    if ((ps_alignment_iter_t *)hyp_len == (ps_alignment_iter_t *)0x0) {
      search_local = (ps_search_t *)0x0;
    }
    else {
      word = (char *)0x0;
      for (; hyp_len != 0; hyp_len = (size_t)ps_alignment_iter_next((ps_alignment_iter_t *)hyp_len))
      {
        ppVar4 = ps_alignment_iter_get((ps_alignment_iter_t *)hyp_len);
        iVar3 = dict_real_word(search->dict,(ppVar4->id).wid);
        if (iVar3 != 0) {
          pdVar1 = search->dict->word;
          pdVar2 = search->dict->word;
          ppVar4 = ps_alignment_iter_get((ps_alignment_iter_t *)hyp_len);
          pcVar6 = pdVar1[pdVar2[(ppVar4->id).wid].basewid].word;
          if (pcVar6 == (char *)0x0) {
            ppVar4 = ps_alignment_iter_get((ps_alignment_iter_t *)hyp_len);
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                    ,0x188,"Unknown word id %d in alignment",(ulong)(uint)(ppVar4->id).wid);
            return (char *)0x0;
          }
          sVar5 = strlen(pcVar6);
          word = word + sVar5 + 1;
        }
      }
      pcVar6 = (char *)__ckd_calloc__((size_t)(word + 1),1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                                      ,0x18e);
      search->hyp_str = pcVar6;
      for (hyp_len = (size_t)ps_alignment_words((ps_alignment_t *)search[1].type); hyp_len != 0;
          hyp_len = (size_t)ps_alignment_iter_next((ps_alignment_iter_t *)hyp_len)) {
        ppVar4 = ps_alignment_iter_get((ps_alignment_iter_t *)hyp_len);
        iVar3 = dict_real_word(search->dict,(ppVar4->id).wid);
        if (iVar3 != 0) {
          strcat(search->hyp_str,
                 search->dict->word[search->dict->word[(ppVar4->id).wid].basewid].word);
          strcat(search->hyp_str," ");
        }
        *out_score = ppVar4->score;
      }
      pcVar6 = search->hyp_str;
      sVar5 = strlen(search->hyp_str);
      pcVar6[sVar5 - 1] = '\0';
      search_local = (ps_search_t *)search->hyp_str;
    }
  }
  return (char *)search_local;
}

Assistant:

static char const *
state_align_search_hyp(ps_search_t *search, int32 *out_score)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    ps_alignment_iter_t *itor;
    size_t hyp_len;

    if (search->hyp_str)
        ckd_free(search->hyp_str);
    search->hyp_str = NULL;
    if (sas->al == NULL)
        return NULL;
    itor = ps_alignment_words(sas->al);
    if (itor == NULL)
        return NULL;
    for (hyp_len = 0; itor; itor = ps_alignment_iter_next(itor)) {
        const char *word;
        int32 wid = ps_alignment_iter_get(itor)->id.wid;

        if (dict_real_word(ps_search_dict(search), wid)) {
            word = dict_basestr(ps_search_dict(search),
                                ps_alignment_iter_get(itor)->id.wid);
            if (word == NULL) {
                E_ERROR("Unknown word id %d in alignment",
                        ps_alignment_iter_get(itor)->id.wid);
                return NULL;
            }
            hyp_len += strlen(word) + 1;
        }
    }
    search->hyp_str = ckd_calloc(hyp_len + 1, sizeof(*search->hyp_str));
    for (itor = ps_alignment_words(sas->al);
         itor; itor = ps_alignment_iter_next(itor)) {
        ps_alignment_entry_t *ent = ps_alignment_iter_get(itor);
        int32 wid = ent->id.wid;
        const char *word;
        if (dict_real_word(ps_search_dict(search), wid)) {
            word = dict_basestr(ps_search_dict(search),
                                ent->id.wid);
            strcat(search->hyp_str, word);
            strcat(search->hyp_str, " ");
        }
        *out_score = ent->score;
    }
    search->hyp_str[strlen(search->hyp_str) - 1] = '\0';
    return search->hyp_str;
}